

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

float * __thiscall cimg_library::CImg<float>::min_max<float>(CImg<float> *this,float *max_val)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  bool bVar7;
  CImgInstanceException *this_00;
  char *pcVar8;
  char *pcVar9;
  unsigned_long uVar10;
  float val;
  float *_maxptrs;
  float *ptrs;
  float max_value;
  float min_value;
  float *ptr_min;
  float *max_val_local;
  CImg<float> *this_local;
  
  bVar7 = is_empty(this);
  if (!bVar7) {
    _max_value = this->_data;
    ptrs._0_4_ = *_max_value;
    _maxptrs = this->_data;
    pfVar6 = this->_data;
    uVar10 = size(this);
    ptrs._4_4_ = ptrs._0_4_;
    for (; _maxptrs < pfVar6 + uVar10; _maxptrs = _maxptrs + 1) {
      fVar1 = *_maxptrs;
      if (fVar1 < ptrs._4_4_) {
        _max_value = _maxptrs;
        ptrs._4_4_ = fVar1;
      }
      if (ptrs._0_4_ < fVar1) {
        ptrs._0_4_ = fVar1;
      }
    }
    *max_val = ptrs._0_4_;
    return _max_value;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  uVar2 = this->_width;
  uVar3 = this->_height;
  uVar4 = this->_depth;
  uVar5 = this->_spectrum;
  pfVar6 = this->_data;
  pcVar8 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar8 = "";
  }
  pcVar9 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min_max(): Empty instance.",
             (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,pfVar6,pcVar8,pcVar9);
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const T& min_max(t& max_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min_max(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min, max_value = min_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val<min_value) { min_value = val; ptr_min = ptrs; }
        if (val>max_value) max_value = val;
      }
      max_val = (t)max_value;
      return *ptr_min;
    }